

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

Hypothesis * __thiscall
sentencepiece::model::FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis>::Allocate
          (FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis> *this)

{
  Hypothesis *pHVar1;
  undefined1 auVar2 [16];
  size_t __n;
  size_t sVar3;
  ulong uVar4;
  pointer ppHVar5;
  Hypothesis *chunk;
  
  uVar4 = this->element_index_;
  sVar3 = this->chunk_index_;
  if (this->chunk_size_ <= uVar4) {
    sVar3 = sVar3 + 1;
    this->chunk_index_ = sVar3;
    this->element_index_ = 0;
    uVar4 = 0;
  }
  ppHVar5 = (this->freelist_).
            super__Vector_base<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (sVar3 == (long)(this->freelist_).
                     super__Vector_base<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppHVar5 >> 3) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->chunk_size_;
    __n = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      uVar4 = __n;
    }
    chunk = (Hypothesis *)operator_new__(uVar4);
    memset(chunk,0,__n);
    std::
    vector<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
    ::push_back(&this->freelist_,&chunk);
    sVar3 = this->chunk_index_;
    ppHVar5 = (this->freelist_).
              super__Vector_base<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = this->element_index_;
  }
  pHVar1 = ppHVar5[sVar3];
  this->element_index_ = uVar4 + 1;
  return pHVar1 + uVar4;
}

Assistant:

T* Allocate() {
    if (element_index_ >= chunk_size_) {
      ++chunk_index_;
      element_index_ = 0;
    }

    if (chunk_index_ == freelist_.size()) {
      T* chunk = new T[chunk_size_];
      memset(static_cast<void*>(chunk), 0, sizeof(*chunk) * chunk_size_);
      freelist_.push_back(chunk);
    }

    T* result = freelist_[chunk_index_] + element_index_;
    ++element_index_;

    return result;
  }